

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O1

void __thiscall box::box(box *this,vec3 *p0,vec3 *p1,shared_ptr<material> *ptr)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *this_00;
  double dVar1;
  undefined1 local_c9;
  xy_rect *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  value_type local_90;
  value_type local_80;
  value_type local_70;
  value_type local_60;
  value_type local_50;
  value_type local_40;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012e028;
  (this->box_max).e[1] = 0.0;
  (this->box_max).e[2] = 0.0;
  (this->box_min).e[2] = 0.0;
  (this->box_max).e[0] = 0.0;
  (this->box_min).e[0] = 0.0;
  (this->box_min).e[1] = 0.0;
  (this->sides).super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  this_00 = &(this->sides).objects;
  (this->sides).objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sides).objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sides).objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = p0->e[1];
  (this->box_min).e[0] = p0->e[0];
  (this->box_min).e[1] = dVar1;
  (this->box_min).e[2] = p0->e[2];
  dVar1 = p1->e[1];
  (this->box_max).e[0] = p1->e[0];
  (this->box_max).e[1] = dVar1;
  (this->box_max).e[2] = p1->e[2];
  local_98 = p0->e[0];
  local_a0 = p1->e[0];
  local_a8 = p0->e[1];
  local_b8 = p1->e[1];
  local_b0 = p1->e[2];
  local_c8 = (xy_rect *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xy_rect,std::allocator<xy_rect>,double,double,double,double,double,std::shared_ptr<material>&>
            (&_Stack_c0,&local_c8,(allocator<xy_rect> *)&local_c9,&local_98,&local_a0,&local_a8,
             &local_b8,&local_b0,ptr);
  local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_hittable;
  local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (xy_rect *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_40);
  if (local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  local_98 = p0->e[0];
  local_a0 = p1->e[0];
  local_a8 = p0->e[1];
  local_b8 = p1->e[1];
  local_b0 = p0->e[2];
  local_c8 = (xy_rect *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xy_rect,std::allocator<xy_rect>,double,double,double,double,double,std::shared_ptr<material>&>
            (&_Stack_c0,&local_c8,(allocator<xy_rect> *)&local_c9,&local_98,&local_a0,&local_a8,
             &local_b8,&local_b0,ptr);
  local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_hittable;
  local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (xy_rect *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_50);
  if (local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  local_98 = p0->e[0];
  local_a0 = p1->e[0];
  local_a8 = p0->e[2];
  local_b8 = p1->e[2];
  local_b0 = p1->e[1];
  local_c8 = (xy_rect *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xz_rect,std::allocator<xz_rect>,double,double,double,double,double,std::shared_ptr<material>&>
            (&_Stack_c0,(xz_rect **)&local_c8,(allocator<xz_rect> *)&local_c9,&local_98,&local_a0,
             &local_a8,&local_b8,&local_b0,ptr);
  local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_hittable;
  local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (xy_rect *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_60);
  if (local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  local_98 = p0->e[0];
  local_a0 = p1->e[0];
  local_a8 = p0->e[2];
  local_b8 = p1->e[2];
  local_b0 = p0->e[1];
  local_c8 = (xy_rect *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xz_rect,std::allocator<xz_rect>,double,double,double,double,double,std::shared_ptr<material>&>
            (&_Stack_c0,(xz_rect **)&local_c8,(allocator<xz_rect> *)&local_c9,&local_98,&local_a0,
             &local_a8,&local_b8,&local_b0,ptr);
  local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_hittable;
  local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (xy_rect *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_70);
  if (local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  local_98 = p0->e[1];
  local_a0 = p1->e[1];
  local_a8 = p0->e[2];
  local_b8 = p1->e[2];
  local_b0 = p1->e[0];
  local_c8 = (xy_rect *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yz_rect,std::allocator<yz_rect>,double,double,double,double,double,std::shared_ptr<material>&>
            (&_Stack_c0,(yz_rect **)&local_c8,(allocator<yz_rect> *)&local_c9,&local_98,&local_a0,
             &local_a8,&local_b8,&local_b0,ptr);
  local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_hittable;
  local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (xy_rect *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_80);
  if (local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  local_98 = p0->e[1];
  local_a0 = p1->e[1];
  local_a8 = p0->e[2];
  local_b8 = p1->e[2];
  local_b0 = p0->e[0];
  local_c8 = (xy_rect *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yz_rect,std::allocator<yz_rect>,double,double,double,double,double,std::shared_ptr<material>&>
            (&_Stack_c0,(yz_rect **)&local_c8,(allocator<yz_rect> *)&local_c9,&local_98,&local_a0,
             &local_a8,&local_b8,&local_b0,ptr);
  local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_hittable;
  local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (xy_rect *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_90);
  if (local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  return;
}

Assistant:

box::box(const vec3& p0, const vec3& p1, shared_ptr<material> ptr) {
    box_min = p0;
    box_max = p1;

    sides.add(make_shared<xy_rect>(p0.x(), p1.x(), p0.y(), p1.y(), p1.z(), ptr));
    sides.add(make_shared<xy_rect>(p0.x(), p1.x(), p0.y(), p1.y(), p0.z(), ptr));

    sides.add(make_shared<xz_rect>(p0.x(), p1.x(), p0.z(), p1.z(), p1.y(), ptr));
    sides.add(make_shared<xz_rect>(p0.x(), p1.x(), p0.z(), p1.z(), p0.y(), ptr));

    sides.add(make_shared<yz_rect>(p0.y(), p1.y(), p0.z(), p1.z(), p1.x(), ptr));
    sides.add(make_shared<yz_rect>(p0.y(), p1.y(), p0.z(), p1.z(), p0.x(), ptr));
}